

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O3

BaseState<true> * __thiscall ArrayState<true>::StartArray(ArrayState<true> *this,Context<true> *ctx)

{
  stringstream *psVar1;
  
  if ((ArrayState<true> *)ctx->previous_state == this) {
    psVar1 = Context<true>::error_abi_cxx11_(ctx);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(psVar1 + 0x10),"Nested arrays are not supported",0x1f);
    this = (ArrayState<true> *)0x0;
  }
  else {
    Context<true>::PushNamespace(ctx,ctx->key,ctx->previous_state);
    this->array_hash =
         (ctx->namespace_path).
         super__Vector_base<Namespace<true>,_std::allocator<Namespace<true>_>_>._M_impl.
         super__Vector_impl_data._M_finish[-1].namespace_hash;
  }
  return &this->super_BaseState<true>;
}

Assistant:

BaseState<audit>* StartArray(Context<audit>& ctx)
  {
    if (ctx.previous_state == this)
    {
      ctx.error() << "Nested arrays are not supported";
      return nullptr;
    }

    ctx.PushNamespace(ctx.key, ctx.previous_state);

    array_hash = ctx.CurrentNamespace().namespace_hash;

    return this;
  }